

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  stbi_uc sVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int depth;
  int iVar14;
  byte *pbVar15;
  stbi_uc *psVar16;
  byte *pbVar17;
  char *pcVar18;
  size_t __n;
  stbi_uc *psVar19;
  uint uVar20;
  byte bVar21;
  uint uVar22;
  int out_n;
  uint uVar23;
  long lVar24;
  stbi_uc *psVar25;
  byte bVar26;
  uint uVar27;
  uint uVar28;
  stbi__uint16 *tc_00;
  ulong uVar29;
  stbi__png *z_00;
  ulong uVar30;
  long in_FS_OFFSET;
  ulong local_4d0;
  stbi_uc tc [3];
  ulong local_4b0;
  stbi__uint32 local_488;
  size_t local_478;
  stbi_uc *local_468;
  stbi__uint32 raw_len;
  ulong local_450;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar8 = stbi__check_png_header(s);
  if (iVar8 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar3 = true;
  bVar7 = 0;
  uVar12 = 0;
  bVar4 = false;
  local_4b0 = 0;
  local_478 = 0;
  local_4d0 = 0;
  bVar5 = false;
  bVar26 = 0;
LAB_001160c3:
  iVar8 = stbi__get16be(s);
  uVar9 = stbi__get16be(s);
  uVar27 = iVar8 * 0x10000 + uVar9;
  uVar10 = stbi__get16be(s);
  uVar11 = stbi__get16be(s);
  uVar22 = uVar10 << 0x10 | uVar11;
  uVar23 = (uint)local_4d0;
  if ((int)uVar22 < 0x49484452) {
    if (uVar22 == 0x43674249) {
      bVar4 = true;
LAB_00116423:
      stbi__skip(s,uVar27);
      goto LAB_00116434;
    }
    if (uVar22 != 0x49444154) {
      if (uVar22 != 0x49454e44) goto LAB_00116408;
      if (bVar3) goto LAB_00116758;
      if (scan != 0) {
        return 1;
      }
      if (*ppsVar1 != (stbi_uc *)0x0) {
        raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
        psVar16 = (stbi_uc *)
                  stbi_zlib_decode_malloc_guesssize_headerflag
                            ((char *)*ppsVar1,uVar23,raw_len,(int *)&raw_len,(uint)!bVar4);
        z->expanded = psVar16;
        if (psVar16 == (stbi_uc *)0x0) {
          return 0;
        }
        free(z->idata);
        z->idata = (stbi_uc *)0x0;
        iVar8 = s->img_n + 1;
        iVar13 = s->img_n;
        if (bVar5) {
          iVar13 = iVar8;
        }
        out_n = iVar13;
        if (req_comp != 3) {
          out_n = iVar8;
        }
        if (bVar26 != 0) {
          out_n = iVar13;
        }
        if (iVar8 != req_comp) {
          out_n = iVar13;
        }
        s->img_out_n = out_n;
        local_468 = z->expanded;
        uVar23 = z->depth;
        local_450 = (ulong)uVar23;
        iVar8 = out_n << (uVar23 == 0x10);
        x = z->s->img_x;
        y = z->s->img_y;
        if (bVar7 == 0) {
          iVar8 = stbi__create_png_image_raw(z,local_468,raw_len,out_n,x,y,uVar23,uVar12);
          if (iVar8 == 0) {
            return 0;
          }
        }
        else {
          local_488 = raw_len;
          psVar16 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar8,0);
          __n = (size_t)iVar8;
          uVar30 = (ulong)(uint)(0 << (uVar23 == 0x10));
          do {
            psVar2 = z->s;
            uVar23 = (&DAT_0011f020)[uVar30];
            uVar9 = (&DAT_0011f060)[uVar30];
            uVar28 = ~uVar23 + psVar2->img_x + uVar9;
            uVar22 = uVar28 / uVar9;
            uVar10 = (&DAT_0011f040)[uVar30];
            uVar11 = (&DAT_0011f080)[uVar30];
            uVar20 = ~uVar10 + psVar2->img_y + uVar11;
            uVar27 = uVar20 / uVar11;
            if ((uVar9 <= uVar28) && (uVar11 <= uVar20)) {
              depth = (int)local_450;
              iVar13 = psVar2->img_n;
              iVar14 = stbi__create_png_image_raw
                                 (z,local_468,local_488,out_n,uVar22,uVar27,depth,uVar12);
              if (iVar14 == 0) {
                free(psVar16);
                return 0;
              }
              if (0 < (int)uVar27) {
                iVar14 = uVar10 * iVar8;
                local_4b0 = 0;
                do {
                  if (0 < (int)uVar22) {
                    psVar19 = z->out;
                    psVar25 = psVar16 + (ulong)(z->s->img_x * iVar14) + (long)(int)uVar23 * __n;
                    lVar24 = 0;
                    do {
                      memcpy(psVar25,psVar19 + (local_4b0 * (long)(int)uVar22 + lVar24) * __n,__n);
                      lVar24 = lVar24 + 1;
                      psVar25 = psVar25 + (long)(int)uVar9 * __n;
                    } while (lVar24 < (int)uVar22);
                  }
                  local_4b0 = local_4b0 + 1;
                  iVar14 = iVar14 + uVar11 * iVar8;
                } while (local_4b0 < uVar27);
              }
              uVar27 = (((int)(uVar22 * depth * iVar13 + 7) >> 3) + 1) * uVar27;
              free(z->out);
              local_468 = local_468 + uVar27;
              local_488 = local_488 - uVar27;
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != 7);
          z->out = psVar16;
        }
        if (bVar5) {
          z_00 = (stbi__png *)(ulong)z->s->img_x;
          tc_00 = (stbi__uint16 *)(ulong)z->s->img_y;
          iVar8 = (int)z->out;
          if (z->depth == 0x10) {
            stbi__compute_transparency16(z_00,tc_00,iVar8);
          }
          else {
            stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar8);
          }
        }
        if (((bVar4) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
          stbi__de_iphone((stbi__png *)z->s);
        }
        if (bVar26 == 0) {
          if (bVar5) {
            s->img_n = s->img_n + 1;
          }
        }
        else {
          s->img_n = (uint)bVar26;
          uVar12 = (uint)bVar26;
          if (2 < req_comp) {
            uVar12 = req_comp;
          }
          s->img_out_n = uVar12;
          psVar16 = z->out;
          uVar23 = z->s->img_y * z->s->img_x;
          psVar19 = (stbi_uc *)stbi__malloc_mad2(uVar23,uVar12,0);
          if (psVar19 == (stbi_uc *)0x0) {
LAB_00116cb9:
            *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
            return 0;
          }
          if (uVar12 == 3) {
            if (uVar23 != 0) {
              uVar30 = 0;
              psVar25 = psVar19;
              do {
                uVar29 = (ulong)psVar16[uVar30];
                *psVar25 = palette[uVar29 * 4];
                psVar25[1] = palette[uVar29 * 4 + 1];
                psVar25[2] = palette[uVar29 * 4 + 2];
                psVar25 = psVar25 + 3;
                uVar30 = uVar30 + 1;
              } while (uVar23 != uVar30);
            }
          }
          else if (uVar23 != 0) {
            uVar30 = 0;
            do {
              *(undefined4 *)(psVar19 + uVar30 * 4) =
                   *(undefined4 *)(palette + (ulong)psVar16[uVar30] * 4);
              uVar30 = uVar30 + 1;
            } while (uVar23 != uVar30);
          }
          free(psVar16);
          z->out = psVar19;
        }
        free(z->expanded);
        z->expanded = (stbi_uc *)0x0;
        stbi__get16be(s);
        stbi__get16be(s);
        return 1;
      }
      pcVar18 = "no IDAT";
      goto LAB_0011675f;
    }
    if (!bVar3) {
      if ((bVar26 == 0) || ((uint)local_4b0 != 0)) {
        if (scan == 2) {
          s->img_n = (uint)bVar26;
          return 1;
        }
        uVar9 = uVar27 + uVar23;
        if ((int)uVar9 < (int)uVar23) {
          return 0;
        }
        if ((uint)local_478 < uVar9) {
          uVar23 = 0x1000;
          if (0x1000 < uVar27) {
            uVar23 = uVar27;
          }
          uVar30 = (ulong)uVar23;
          if ((uint)local_478 != 0) {
            uVar30 = local_478;
          }
          do {
            local_478 = uVar30;
            uVar30 = (ulong)((uint)local_478 * 2);
          } while ((uint)local_478 < uVar9);
          psVar16 = (stbi_uc *)realloc(*ppsVar1,local_478);
          if (psVar16 == (stbi_uc *)0x0) goto LAB_00116cb9;
          *ppsVar1 = psVar16;
        }
        else {
          psVar16 = *ppsVar1;
        }
        iVar8 = stbi__getn(s,psVar16 + local_4d0,uVar27);
        bVar3 = false;
        uVar23 = uVar9;
        if (iVar8 != 0) goto LAB_00116434;
        pcVar18 = "outofdata";
      }
      else {
        pcVar18 = "no PLTE";
      }
      goto LAB_0011675f;
    }
  }
  else {
    if (uVar22 == 0x74524e53) {
      if (bVar3) goto LAB_00116758;
      if (*ppsVar1 != (stbi_uc *)0x0) {
        pcVar18 = "tRNS after IDAT";
        goto LAB_0011675f;
      }
      if (bVar26 == 0) {
        uVar9 = s->img_n;
        if ((uVar9 & 1) == 0) {
          pcVar18 = "tRNS with alpha";
          goto LAB_0011675f;
        }
        if (uVar9 * 2 != uVar27) {
LAB_001167da:
          pcVar18 = "bad tRNS len";
          goto LAB_0011675f;
        }
        if (z->depth == 0x10) {
          if (0 < (int)uVar9) {
            lVar24 = 0;
            do {
              iVar8 = stbi__get16be(s);
              tc16[lVar24] = (stbi__uint16)iVar8;
              lVar24 = lVar24 + 1;
            } while (lVar24 < s->img_n);
          }
        }
        else if (0 < (int)uVar9) {
          lVar24 = 0;
          do {
            iVar8 = stbi__get16be(s);
            tc[lVar24] = ""[z->depth] * (char)iVar8;
            lVar24 = lVar24 + 1;
          } while (lVar24 < s->img_n);
        }
        bVar5 = true;
        bVar3 = false;
        bVar26 = 0;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if ((uint)local_4b0 == 0) {
          pcVar18 = "tRNS before PLTE";
          goto LAB_0011675f;
        }
        if ((uint)local_4b0 < uVar27) goto LAB_001167da;
        bVar26 = 4;
        if (uVar27 == 0) goto LAB_001163e1;
        bVar3 = false;
        psVar16 = s->img_buffer;
        uVar30 = 0;
        do {
          if (psVar16 < s->img_buffer_end) {
LAB_00116385:
            s->img_buffer = psVar16 + 1;
            sVar6 = *psVar16;
            psVar16 = psVar16 + 1;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar16 = s->img_buffer;
              goto LAB_00116385;
            }
            sVar6 = '\0';
          }
          palette[uVar30 * 4 + 3] = sVar6;
          uVar30 = uVar30 + 1;
        } while (uVar9 + iVar8 * 0x10000 != uVar30);
      }
LAB_00116434:
      stbi__get16be(s);
      stbi__get16be(s);
      local_4d0 = (ulong)uVar23;
      goto LAB_001160c3;
    }
    if (uVar22 == 0x504c5445) {
      if (!bVar3) {
        if ((uVar27 < 0x301) &&
           (uVar10 = uVar9 * 0xaaab >> 0x11, local_4b0 = (ulong)uVar10, uVar10 * 3 == uVar27)) {
          if (uVar9 < 3) {
LAB_001163e1:
            bVar3 = false;
          }
          else {
            bVar3 = false;
            psVar16 = s->img_buffer;
            uVar30 = 0;
            do {
              psVar19 = s->img_buffer_end;
              if (psVar16 < psVar19) {
LAB_00116493:
                s->img_buffer = psVar16 + 1;
                sVar6 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar16 = s->img_buffer;
                  psVar19 = s->img_buffer_end;
                  goto LAB_00116493;
                }
                sVar6 = '\0';
              }
              palette[uVar30 * 4] = sVar6;
              if (psVar16 < psVar19) {
LAB_001164d1:
                s->img_buffer = psVar16 + 1;
                sVar6 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar16 = s->img_buffer;
                  psVar19 = s->img_buffer_end;
                  goto LAB_001164d1;
                }
                sVar6 = '\0';
              }
              palette[uVar30 * 4 + 1] = sVar6;
              if (psVar16 < psVar19) {
LAB_00116504:
                s->img_buffer = psVar16 + 1;
                sVar6 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar16 = s->img_buffer;
                  goto LAB_00116504;
                }
                sVar6 = '\0';
              }
              palette[uVar30 * 4 + 2] = sVar6;
              palette[uVar30 * 4 + 3] = 0xff;
              uVar30 = uVar30 + 1;
            } while (local_4b0 != uVar30);
          }
          goto LAB_00116434;
        }
        pcVar18 = "invalid PLTE";
        goto LAB_0011675f;
      }
    }
    else {
      if (uVar22 == 0x49484452) {
        if (!bVar3) {
          pcVar18 = "multiple IHDR";
          goto LAB_0011675f;
        }
        if (uVar27 != 0xd) {
          pcVar18 = "bad IHDR len";
          goto LAB_0011675f;
        }
        iVar8 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        s->img_x = uVar12 | iVar8 << 0x10;
        iVar8 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        uVar12 = uVar12 | iVar8 << 0x10;
        s->img_y = uVar12;
        if ((0x1000000 < uVar12) || (0x1000000 < s->img_x)) {
LAB_0011672c:
          pcVar18 = "too large";
LAB_0011675f:
          *(char **)(in_FS_OFFSET + -0x10) = pcVar18;
          return 0;
        }
        pbVar15 = s->img_buffer;
        if (pbVar15 < s->img_buffer_end) {
LAB_001161be:
          pbVar17 = pbVar15 + 1;
          s->img_buffer = pbVar17;
          bVar7 = *pbVar15;
          z->depth = (uint)bVar7;
          if ((bVar7 < 0x11) && ((0x10116U >> (bVar7 & 0x1f) & 1) != 0)) {
            if (s->img_buffer_end <= pbVar17) {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar17 = s->img_buffer;
                goto LAB_0011620e;
              }
              bVar21 = 0;
              uVar12 = 0;
              goto LAB_00116632;
            }
LAB_0011620e:
            pbVar15 = pbVar17 + 1;
            s->img_buffer = pbVar15;
            bVar21 = *pbVar17;
            uVar12 = (uint)bVar21;
            if (6 < uVar12) {
LAB_00116747:
              pcVar18 = "bad ctype";
              goto LAB_0011675f;
            }
            pbVar17 = pbVar15;
            if (bVar21 == 3) {
              if (z->depth == 0x10) goto LAB_00116747;
              uVar12 = 3;
              bVar21 = 3;
              bVar26 = 3;
            }
            else if ((bVar21 & 1) != 0) goto LAB_00116747;
LAB_00116632:
            if (pbVar17 < s->img_buffer_end) {
LAB_00116651:
              s->img_buffer = pbVar17 + 1;
              if (*pbVar17 != 0) {
                pcVar18 = "bad comp method";
                goto LAB_0011675f;
              }
            }
            else if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar17 = s->img_buffer;
              goto LAB_00116651;
            }
            sVar6 = stbi__get8(s);
            if (sVar6 != '\0') {
              pcVar18 = "bad filter method";
              goto LAB_0011675f;
            }
            bVar7 = stbi__get8(s);
            if (1 < bVar7) {
              pcVar18 = "bad interlace method";
              goto LAB_0011675f;
            }
            uVar9 = s->img_x;
            if ((uVar9 == 0) || (uVar10 = s->img_y, uVar10 == 0)) {
              pcVar18 = "0-pixel image";
              goto LAB_0011675f;
            }
            if (bVar26 != 0) {
              s->img_n = 1;
              bVar3 = false;
              if (uVar10 <= (uint)(0x40000000 / (ulong)uVar9 >> 2)) goto LAB_00116434;
              goto LAB_0011672c;
            }
            uVar11 = (uint)(3 < bVar21) + (uVar12 & 2) + 1;
            s->img_n = uVar11;
            if ((uint)((0x40000000 / (ulong)uVar9) / (ulong)uVar11) < uVar10) goto LAB_0011672c;
            bVar3 = false;
            bVar26 = 0;
            if (scan == 2) {
              return 1;
            }
            goto LAB_00116434;
          }
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar15 = s->img_buffer;
            goto LAB_001161be;
          }
          z->depth = 0;
        }
        pcVar18 = "1/2/4/8/16-bit only";
        goto LAB_0011675f;
      }
LAB_00116408:
      if (!bVar3) {
        bVar3 = false;
        if ((uVar10 >> 0xd & 1) == 0) {
          stbi__parse_png_file::invalid_chunk[0] = (char)(uVar10 >> 8);
          stbi__parse_png_file::invalid_chunk[1] = (char)uVar10;
          stbi__parse_png_file::invalid_chunk[2] = (char)(uVar11 >> 8);
          stbi__parse_png_file::invalid_chunk[3] = (char)uVar11;
          *(char **)(in_FS_OFFSET + -0x10) = stbi__parse_png_file::invalid_chunk;
          return 0;
        }
        goto LAB_00116423;
      }
    }
  }
LAB_00116758:
  pcVar18 = "first not IHDR";
  goto LAB_0011675f;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}